

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_help.c
# Opt level: O3

void test_option_help(void)

{
  int *piVar1;
  int iVar2;
  wchar_t wVar3;
  int *__ptr;
  int *piVar4;
  size_t plen;
  ulong local_38;
  
  wVar3 = systemf("%s --help >help.stdout 2>help.stderr",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_help.c"
                      ,L'#',(long)wVar3,"r",0,"0",(void *)0x0);
  failure("--help should generate nothing to stderr.");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_help.c"
             ,L'%',"help.stderr");
  __ptr = (int *)slurpfile(&local_38,"help.stdout");
  failure("Help output should be long enough.");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_help.c"
                   ,L')',(uint)(6 < local_38),"plen >= 7",(void *)0x0);
  failure("First line of help output should contain string \'bsdcpio\'");
  piVar4 = __ptr;
  do {
    wVar3 = L'\0';
    if (((char)*piVar4 == '\0') || (wVar3 = L'\0', (char)*piVar4 == '\n')) goto LAB_0010dd5d;
    iVar2 = *piVar4;
    piVar1 = (int *)((long)piVar4 + 3);
    piVar4 = (int *)((long)piVar4 + 1);
  } while (*piVar1 != 0x6f697063 || iVar2 != 0x63647362);
  wVar3 = L'\x01';
LAB_0010dd5d:
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_help.c"
                   ,L'+',wVar3,"in_first_line(p, \"bsdcpio\")",(void *)0x0);
  free(__ptr);
  wVar3 = systemf("%s -h >h.stdout 2>h.stderr",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_help.c"
                      ,L'4',(long)wVar3,"r",0,"0",(void *)0x0);
  failure("-h should generate nothing to stderr.");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_help.c"
             ,L'6',"h.stderr");
  failure("stdout should be same for -h and --help");
  assertion_equal_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_help.c"
             ,L'8',"h.stdout","help.stdout");
  wVar3 = systemf("%s -W help >Whelp.stdout 2>Whelp.stderr",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_help.c"
                      ,L'<',(long)wVar3,"r",0,"0",(void *)0x0);
  failure("-W help should generate nothing to stderr.");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_help.c"
             ,L'>',"Whelp.stderr");
  failure("stdout should be same for -W help and --help");
  assertion_equal_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_help.c"
             ,L'@',"Whelp.stdout","help.stdout");
  return;
}

Assistant:

DEFINE_TEST(test_option_help)
{
	int r;
	char *p;
	size_t plen;

	/* Exercise --help option. */
	r = systemf("%s --help >help.stdout 2>help.stderr", testprog);
	assertEqualInt(r, 0);
	failure("--help should generate nothing to stderr.");
	assertEmptyFile("help.stderr");
	/* Help message should start with name of program. */
	p = slurpfile(&plen, "help.stdout");
	failure("Help output should be long enough.");
	assert(plen >= 7);
	failure("First line of help output should contain string 'bsdcpio'");
	assert(in_first_line(p, "bsdcpio"));
	/*
	 * TODO: Extend this check to further verify that --help output
	 * looks approximately right.
	 */
	free(p);

	/* -h option should generate the same output. */
	r = systemf("%s -h >h.stdout 2>h.stderr", testprog);
	assertEqualInt(r, 0);
	failure("-h should generate nothing to stderr.");
	assertEmptyFile("h.stderr");
	failure("stdout should be same for -h and --help");
	assertEqualFile("h.stdout", "help.stdout");

	/* -W help should be another synonym. */
	r = systemf("%s -W help >Whelp.stdout 2>Whelp.stderr", testprog);
	assertEqualInt(r, 0);
	failure("-W help should generate nothing to stderr.");
	assertEmptyFile("Whelp.stderr");
	failure("stdout should be same for -W help and --help");
	assertEqualFile("Whelp.stdout", "help.stdout");
}